

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skip_list.c
# Opt level: O0

void test_skiplist_get_node_several(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  int iVar2;
  ion_sl_node_t *piVar3;
  ion_sl_node_t *node;
  int key_1;
  ion_status_t status;
  int key;
  int i;
  ion_byte_t buffer [10];
  int targets [50];
  undefined1 local_48 [8];
  ion_skiplist_t skiplist;
  planck_unit_test_t *tc_local;
  
  skiplist._48_8_ = tc;
  initialize_skiplist_std_conditions((ion_skiplist_t *)local_48);
  status.count = 0;
  while( true ) {
    if (0x31 < status.count) {
      status.count = 0;
      while( true ) {
        if (0x31 < status.count) {
          sl_destroy((ion_skiplist_t *)local_48);
          return;
        }
        node._0_4_ = targets[(long)status.count + -2];
        piVar3 = sl_find_node((ion_skiplist_t *)local_48,&node);
        sprintf((char *)((long)&key + 2),"TEST %d",(ulong)(uint)node);
        pVar1 = planck_unit_assert_true
                          ((planck_unit_test_t *)skiplist._48_8_,(uint)(*piVar3->key == (uint)node),
                           0x225,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                           ,"condition was false, expected true");
        if (pVar1 == '\0') break;
        pVar1 = planck_unit_assert_str_are_equal
                          ((planck_unit_test_t *)skiplist._48_8_,(char *)piVar3->value,
                           (char *)((long)&key + 2),0x226,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                          );
        if (pVar1 == '\0') {
          longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
        }
        status.count = status.count + 1;
      }
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    iVar2 = rand();
    status._0_4_ = iVar2 % 1000;
    targets[(long)status.count + -2] = status._0_4_;
    sprintf((char *)((long)&key + 2),"TEST %d",(ulong)(uint)status._0_4_);
    register0x00000000 = sl_insert((ion_skiplist_t *)local_48,&status,(ion_value_t)((long)&key + 2))
    ;
    pVar1 = planck_unit_assert_true
                      ((planck_unit_test_t *)skiplist._48_8_,(uint)(node._4_1_ == '\0'),0x218,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') break;
    pVar1 = planck_unit_assert_true
                      ((planck_unit_test_t *)skiplist._48_8_,(uint)(key_1 == 1),0x219,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    status.count = status.count + 1;
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_skiplist_get_node_several(
	planck_unit_test_t *tc
) {
	PRINT_HEADER();

	ion_skiplist_t skiplist;

	initialize_skiplist_std_conditions(&skiplist);

	int			targets[50];
	ion_byte_t	buffer[10];
	int			i;

	for (i = 0; i < 50; i++) {
		int key = rand() % 1000;

		targets[i] = key;
		sprintf((char *) buffer, "TEST %d", key);

		ion_status_t status = sl_insert(&skiplist, (ion_key_t) &key, buffer);

		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

#if ION_DEBUG
	print_skiplist(&skip_list);
#endif

	for (i = 0; i < 50; i++) {
		int				key		= targets[i];
		ion_sl_node_t	*node	= sl_find_node(&skiplist, (ion_key_t) &key);

		sprintf((char *) buffer, "TEST %d", key);
		PLANCK_UNIT_ASSERT_TRUE(tc, *((int *) node->key) == key);
		PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) node->value, (char *) buffer);
	}

	sl_destroy(&skiplist);
}